

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

string * cfgfile::
         format_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::wstring_trait_t>
         ::from_string(parser_info_t<cfgfile::wstring_trait_t> *param_1,string_t *value)

{
  bool bVar1;
  undefined8 in_RDX;
  string *in_RDI;
  wchar_t *ch;
  const_iterator __end2;
  const_iterator __begin2;
  string_t *__range2;
  string *res;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_stack_ffffffffffffff98;
  string *__lhs;
  __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_30;
  undefined8 local_28;
  undefined1 local_19;
  undefined8 local_18;
  
  local_19 = 0;
  __lhs = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  local_28 = local_18;
  local_30._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  std::__cxx11::wstring::end();
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                             *)__lhs,in_stack_ffffffffffffff98), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator*(&local_30);
    std::__cxx11::string::push_back((char)__lhs);
    __gnu_cxx::
    __normal_iterator<const_wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&local_30);
  }
  return in_RDI;
}

Assistant:

static std::string from_string( const parser_info_t< wstring_trait_t > &,
		const wstring_trait_t::string_t & value )
	{
		std::string res;

		for( const auto & ch : value )
			res.push_back( static_cast< char > ( ch ) );

		return res;
	}